

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcold.c
# Opt level: O0

int ffgcvm(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          double nulval,double *array,int *anynul,int *status)

{
  int *in_stack_00000010;
  char cdummy;
  double in_stack_00007258;
  long in_stack_00007260;
  LONGLONG in_stack_00007268;
  LONGLONG in_stack_00007270;
  LONGLONG in_stack_00007278;
  int in_stack_00007284;
  fitsfile *in_stack_00007288;
  int in_stack_000072d0;
  double *in_stack_000072d8;
  char *in_stack_000072e0;
  int *in_stack_000072e8;
  int *in_stack_000072f0;
  
  ffgcld(in_stack_00007288,in_stack_00007284,in_stack_00007278,in_stack_00007270,in_stack_00007268,
         in_stack_00007260,in_stack_000072d0,in_stack_00007258,in_stack_000072d8,in_stack_000072e0,
         in_stack_000072e8,in_stack_000072f0);
  return *in_stack_00000010;
}

Assistant:

int ffgcvm(fitsfile *fptr,   /* I - FITS file pointer                       */
           int  colnum,      /* I - number of column to read (1 = 1st col)  */
           LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
           LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
           LONGLONG  nelem,      /* I - number of values to read                */
           double nulval,    /* I - value for null pixels                   */
           double *array,    /* O - array of values that are read           */
           int  *anynul,     /* O - set to 1 if any values are null; else 0 */
           int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU. Automatic
  datatype conversion will be performed if the datatype of the column does not
  match the datatype of the array parameter. The output values will be scaled 
  by the FITS TSCALn and TZEROn values if these values have been defined.
  Any undefined pixels will be set equal to the value of 'nulval' unless
  nulval = 0 in which case no checks for undefined pixels will be made.

  TSCAL and ZERO should not be used with complex values. 
*/
{
    char cdummy;

    /* a complex double value is interpreted as a pair of double values,   */
    /* thus need to multiply the first element and number of elements by 2 */

    ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
        1, 1, nulval, array, &cdummy, anynul, status);
    return(*status);
}